

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_ecf33::DirectoryTreeStructureSignatureTask::inputsAvailable
          (DirectoryTreeStructureSignatureTask *this,TaskInterface ti)

{
  bool bVar1;
  iterator first;
  iterator last;
  reference args_1;
  FileInfo *pFVar2;
  size_t sig;
  CommandSignature local_248;
  BuildValue local_240;
  ValueType local_1d0;
  unsigned_long local_1b8;
  size_t local_1b0;
  uchar *local_1a8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1a0;
  hash_code local_198;
  size_t local_190;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_188;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_178;
  hash_code local_170;
  size_t local_168;
  size_t local_160;
  undefined1 local_158 [8];
  BuildValue value_1;
  SubpathInfo *info;
  iterator __end2;
  iterator __begin2;
  vector<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo>_>
  *__range2;
  hash_code local_b0;
  size_t local_a8;
  size_t local_a0;
  undefined1 local_98 [8];
  BuildValue value;
  hash_code code;
  DirectoryTreeStructureSignatureTask *this_local;
  TaskInterface ti_local;
  
  ti_local.impl = ti.ctx;
  this_local = (DirectoryTreeStructureSignatureTask *)ti.impl;
  value.stringValues.size = (uint64_t)llvm::hash_value<char>(&this->path);
  llbuild::buildsystem::BuildValue::fromData((BuildValue *)local_98,&this->directoryValue);
  bVar1 = llbuild::buildsystem::BuildValue::isDirectoryContents((BuildValue *)local_98);
  if (bVar1) {
    pFVar2 = llbuild::buildsystem::BuildValue::getOutputInfo((BuildValue *)local_98);
    local_a0 = (size_t)llvm::hash_combine<llvm::hash_code,unsigned_long>
                                 ((hash_code *)&value.stringValues.size,&pFVar2->mode);
    value.stringValues.size = local_a0;
  }
  else {
    first = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&this->directoryValue)
    ;
    last = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(&this->directoryValue);
    local_b0 = llvm::
               hash_combine_range<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                         ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           )first._M_current,
                          (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           )last._M_current);
    local_a8 = (size_t)llvm::hash_combine<llvm::hash_code,llvm::hash_code>
                                 ((hash_code *)&value.stringValues.size,&local_b0);
    value.stringValues.size = local_a8;
  }
  llbuild::buildsystem::BuildValue::~BuildValue((BuildValue *)local_98);
  __end2 = std::
           vector<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo>_>
           ::begin(&this->childResults);
  info = (SubpathInfo *)
         std::
         vector<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo>_>
         ::end(&this->childResults);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo_*,_std::vector<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo>_>_>
                                *)&info);
    if (!bVar1) break;
    args_1 = __gnu_cxx::
             __normal_iterator<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo_*,_std::vector<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo>_>_>
             ::operator*(&__end2);
    value_1.stringValues.size =
         (uint64_t)
         llvm::hash_combine<llvm::hash_code,std::__cxx11::string>
                   ((hash_code *)&value.stringValues.size,&args_1->filename);
    value.stringValues.size = value_1.stringValues.size;
    llbuild::buildsystem::BuildValue::fromData((BuildValue *)local_158,&args_1->value);
    bVar1 = llbuild::buildsystem::BuildValue::isExistingInput((BuildValue *)local_158);
    if (bVar1) {
      pFVar2 = llbuild::buildsystem::BuildValue::getOutputInfo((BuildValue *)local_158);
      local_160 = (size_t)llvm::hash_combine<llvm::hash_code,unsigned_long>
                                    ((hash_code *)&value.stringValues.size,&pFVar2->mode);
      value.stringValues.size = local_160;
    }
    else {
      local_178._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                              (&args_1->value);
      data = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(&args_1->value);
      local_170 = llvm::
                  hash_combine_range<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                            (local_178,
                             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              )data);
      local_168 = (size_t)llvm::hash_combine<llvm::hash_code,llvm::hash_code>
                                    ((hash_code *)&value.stringValues.size,&local_170);
      value.stringValues.size = local_168;
    }
    bVar1 = llvm::Optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::hasValue
                      (&args_1->directoryStructureSignatureValue);
    if (bVar1) {
      local_188 = llvm::Optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
                  getValue(&args_1->directoryStructureSignatureValue);
      local_1a0._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(local_188);
      local_1a8 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                     (local_188);
      local_198 = llvm::
                  hash_combine_range<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                            (local_1a0,
                             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              )local_1a8);
      local_190 = (size_t)llvm::hash_combine<llvm::hash_code,llvm::hash_code>
                                    ((hash_code *)&value.stringValues.size,&local_198);
      value.stringValues.size = local_190;
    }
    else {
      local_1b8 = 0xc183979c3e98722e;
      local_1b0 = (size_t)llvm::hash_combine<llvm::hash_code,unsigned_long>
                                    ((hash_code *)&value.stringValues.size,&local_1b8);
      value.stringValues.size = local_1b0;
    }
    llbuild::buildsystem::BuildValue::~BuildValue((BuildValue *)local_158);
    __gnu_cxx::
    __normal_iterator<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo_*,_std::vector<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo>_>_>
    ::operator++(&__end2);
  }
  sig = llvm::hash_code::operator_cast_to_unsigned_long((hash_code *)&value.stringValues.size);
  llbuild::basic::CommandSignature::CommandSignature(&local_248,sig);
  llbuild::buildsystem::BuildValue::makeDirectoryTreeStructureSignature(&local_240,local_248);
  llbuild::buildsystem::BuildValue::toData(&local_1d0,&local_240);
  llbuild::core::TaskInterface::complete((TaskInterface *)&this_local,&local_1d0,false);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_1d0);
  llbuild::buildsystem::BuildValue::~BuildValue(&local_240);
  return;
}

Assistant:

virtual void inputsAvailable(TaskInterface ti) override {
    // Compute the signature across all of the inputs.
    using llvm::hash_combine;
    llvm::hash_code code = hash_value(path);

    // Only merge the structure information on the directory itself.
    {
      // We need to merge mode information about the directory itself, in case
      // it changes type.
      auto value = BuildValue::fromData(directoryValue);
      if (value.isDirectoryContents()) {
        code = hash_combine(code, value.getOutputInfo().mode);
      } else {
        code = hash_combine(
            code, hash_combine_range(directoryValue.begin(),
                                     directoryValue.end()));
      }
    }
    
    // For now, we represent this task as the aggregation of all the inputs.
    for (const auto& info: childResults) {
      // We only merge the "structural" information on a child; i.e. its
      // filename and type.
      code = hash_combine(code, info.filename);
      auto value = BuildValue::fromData(info.value);
      if (value.isExistingInput()) {
        code = hash_combine(code, value.getOutputInfo().mode);
      } else {
        // If this node has been modified to report a non-file value, just merge
        // the encoded representation.
        code = hash_combine(
            code, hash_combine_range(info.value.begin(), info.value.end()));
      }
      
      if (info.directoryStructureSignatureValue.hasValue()) {
        auto& data = info.directoryStructureSignatureValue.getValue();
        code = hash_combine(
            code, hash_combine_range(data.begin(), data.end()));
      } else {
        // Combine a random number to represent nil.
        code = hash_combine(code, 0XC183979C3E98722E);
      }
    }
    
    // Compute the signature.
    ti.complete(BuildValue::makeDirectoryTreeStructureSignature(
                  CommandSignature(uint64_t(code))).toData());
  }